

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall pbrt::CameraBase::InitMetadata(CameraBase *this,ImageMetadata *metadata)

{
  Transform local_120;
  Transform local_a0;
  
  AnimatedTransform::Interpolate(&local_120,(AnimatedTransform *)this,this->shutterOpen);
  Transform::operator*(&local_a0,&(this->cameraTransform).worldFromRender,&local_120);
  *(undefined8 *)&(metadata->cameraFromWorld).optionalValue = local_a0.mInv.m[0]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 8) = local_a0.mInv.m[0]._8_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x10) =
       local_a0.mInv.m[1]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x18) =
       local_a0.mInv.m[1]._8_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x20) =
       local_a0.mInv.m[2]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x28) =
       local_a0.mInv.m[2]._8_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x30) =
       local_a0.mInv.m[3]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x38) =
       local_a0.mInv.m[3]._8_8_;
  (metadata->cameraFromWorld).set = true;
  return;
}

Assistant:

void CameraBase::InitMetadata(ImageMetadata *metadata) const {
    metadata->cameraFromWorld = cameraTransform.CameraFromWorld(shutterOpen).GetMatrix();
}